

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-product.c
# Opt level: O0

int coda_get_product_type(coda_product *product,char **product_type)

{
  char **product_type_local;
  coda_product *product_local;
  
  if (product == (coda_product *)0x0) {
    coda_set_error(-100,"product file argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,0x3c6);
    product_local._4_4_ = -1;
  }
  else if (product_type == (char **)0x0) {
    coda_set_error(-100,"product_type argument is NULL (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-product.c"
                   ,0x3cb);
    product_local._4_4_ = -1;
  }
  else {
    if (product->product_definition == (coda_product_definition *)0x0) {
      *product_type = (char *)0x0;
    }
    else {
      *product_type = product->product_definition->product_type->name;
    }
    product_local._4_4_ = 0;
  }
  return product_local._4_4_;
}

Assistant:

LIBCODA_API int coda_get_product_type(const coda_product *product, const char **product_type)
{
    if (product == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product file argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }
    if (product_type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "product_type argument is NULL (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    if (product->product_definition != NULL)
    {
        *product_type = product->product_definition->product_type->name;
    }
    else
    {
        *product_type = NULL;
    }

    return 0;
}